

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,Monom *m)

{
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> cont;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_ffffffffffffff40;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff48;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff50;
  undefined1 **local_88;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_stack_ffffffffffffff90;
  iterator pMVar1;
  undefined1 *in_stack_ffffffffffffffa0;
  undefined1 *local_40;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *summands;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffd0;
  
  pMVar1 = (iterator)&stack0xffffffffffffffa0;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_40 = &stack0xffffffffffffffa0;
  summands = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)0x1;
  cont._M_len = (size_type)in_stack_ffffffffffffffa0;
  cont._M_array = pMVar1;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (in_stack_ffffffffffffff90,cont);
  Polynom(in_stack_ffffffffffffffd0,summands);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
            (in_stack_ffffffffffffff40);
  local_88 = &local_40;
  do {
    local_88 = local_88 + -4;
    Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x3732c4);
  } while (local_88 != (undefined1 **)&stack0xffffffffffffffa0);
  return;
}

Assistant:

Polynom<Number>::Polynom(Monom m) 
  : Polynom(
      Stack<Monom>{m})
{  }